

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O1

bool __thiscall
jsoncons::basic_json_visitor<char>::visit_typed_array
          (basic_json_visitor<char> *this,span<const_double,_18446744073709551615UL> *s,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  undefined7 in_register_00000011;
  pointer pdVar1;
  
  (*this->_vptr_basic_json_visitor[7])(this,s->size_,CONCAT71(in_register_00000011,tag));
  if (s->size_ != 0) {
    pdVar1 = s->data_;
    do {
      (*this->_vptr_basic_json_visitor[0x12])(*pdVar1,this,0,context,ec);
      pdVar1 = pdVar1 + 1;
    } while (pdVar1 != s->data_ + s->size_);
  }
  (*this->_vptr_basic_json_visitor[8])(this,context,ec);
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const double>& s, 
            semantic_tag tag,
            const ser_context& context, 
            std::error_code& ec)  
        {
            begin_array(s.size(), tag,context, ec);
            for (auto p = s.begin(); p != s.end(); ++p)
            {
                double_value(*p,semantic_tag::none,context, ec);
            }
            end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }